

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManCountMapRefs(Lf_Man_t *p)

{
  Tim_Man_t *pTVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  bool bVar4;
  float fVar5;
  uint local_9c;
  uint local_24;
  int reqTime;
  int Delay;
  int Id;
  int i;
  Gia_Obj_t *pObj;
  Lf_Man_t *p_local;
  
  local_24 = 0;
  for (Delay = 0; iVar2 = Gia_ManCoNum(p->pGia), Delay < iVar2; Delay = Delay + 1) {
    iVar2 = Lf_ObjCoArrival2(p,Delay);
    local_24 = Abc_MaxInt(local_24,iVar2);
  }
  if ((p->pPars->DelayTarget == -1) && (p->pPars->nRelaxRatio != 0)) {
    p->pPars->DelayTarget =
         (int)(((double)(int)local_24 * ((double)p->pPars->nRelaxRatio + 100.0)) / 100.0);
  }
  if (p->pPars->DelayTarget != -1) {
    if ((double)p->pPars->DelayTarget + 0.01 <= (double)(int)local_24) {
      if (p->pPars->nRelaxRatio == 0) {
        Abc_Print(0,"Relaxing user-specified delay target from %d to %d.\n",
                  (ulong)(uint)p->pPars->DelayTarget,(ulong)local_24);
      }
    }
    else {
      local_24 = p->pPars->DelayTarget;
    }
  }
  p->pPars->Delay = (long)(int)local_24;
  p->Switches = 0.0;
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  p->pPars->Mux7 = 0;
  iVar2 = Gia_ManObjNum(p->pGia);
  Vec_IntFill(&p->vRequired,iVar2,1000000000);
  if (p->pPars->fUseMux7 != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  if (p->pGia->pManTime == (void *)0x0) {
    for (Delay = 0; iVar2 = Vec_IntSize(p->pGia->vCos), Delay < iVar2; Delay = Delay + 1) {
      p_00 = p->pGia;
      pObj_00 = Gia_ManCo(p->pGia,Delay);
      iVar2 = Gia_ObjFaninId0p(p_00,pObj_00);
      if (p->pPars->fDoAverage == 0) {
        local_9c = local_24;
      }
      else {
        iVar3 = Lf_ObjCoArrival(p,Delay);
        local_9c = (uint)(((double)iVar3 * ((double)p->pPars->nRelaxRatio + 100.0)) / 100.0);
      }
      Lf_ObjSetRequired(p,iVar2,local_9c);
    }
    Delay = p->pGia->nObjs;
    while( true ) {
      Delay = Delay + -1;
      bVar4 = false;
      if (0 < Delay) {
        _Id = Gia_ManObj(p->pGia,Delay);
        bVar4 = _Id != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar2 = Gia_ObjIsAnd(_Id);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjIsBuf(_Id);
        if (iVar2 == 0) {
          iVar2 = Lf_ObjMapRefNum(p,Delay);
          if (iVar2 != 0) {
            Lf_ManCountMapRefsOne(p,Delay);
          }
        }
        else {
          iVar2 = Gia_ObjFaninId0(_Id,Delay);
          iVar3 = Lf_ObjRequired(p,Delay);
          Lf_ObjSetRequired(p,iVar2,iVar3);
        }
      }
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)p->pGia->pManTime);
    if (p->pPars->fDoAverage == 0) {
      Tim_ManInitPoRequiredAll((Tim_Man_t *)p->pGia->pManTime,(float)(int)local_24);
    }
    else {
      for (Delay = 0; iVar2 = Gia_ManCoNum(p->pGia), Delay < iVar2; Delay = Delay + 1) {
        pTVar1 = (Tim_Man_t *)p->pGia->pManTime;
        iVar2 = Lf_ObjCoArrival(p,Delay);
        Tim_ManSetCoRequired
                  (pTVar1,Delay,
                   (float)(int)(((double)iVar2 * ((double)p->pPars->nRelaxRatio + 100.0)) / 100.0));
      }
    }
    Delay = p->pGia->nObjs;
    while( true ) {
      Delay = Delay + -1;
      bVar4 = false;
      if (0 < Delay) {
        _Id = Gia_ManObj(p->pGia,Delay);
        bVar4 = _Id != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar2 = Gia_ObjIsBuf(_Id);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsAnd(_Id);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsCi(_Id);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjIsCo(_Id);
            if (iVar2 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                            ,0x668,"void Lf_ManCountMapRefs(Lf_Man_t *)");
            }
            pTVar1 = (Tim_Man_t *)p->pGia->pManTime;
            iVar2 = Gia_ObjCioId(_Id);
            fVar5 = Tim_ManGetCoRequired(pTVar1,iVar2);
            iVar2 = Gia_ObjFaninId0(_Id,Delay);
            Lf_ObjSetRequired(p,iVar2,(int)fVar5);
          }
          else {
            pTVar1 = (Tim_Man_t *)p->pGia->pManTime;
            iVar2 = Gia_ObjCioId(_Id);
            iVar3 = Lf_ObjRequired(p,Delay);
            Tim_ManSetCiRequired(pTVar1,iVar2,(float)iVar3);
          }
        }
        else {
          iVar2 = Lf_ObjMapRefNum(p,Delay);
          if (iVar2 != 0) {
            Lf_ManCountMapRefsOne(p,Delay);
          }
        }
      }
      else {
        iVar2 = Gia_ObjFaninId0(_Id,Delay);
        iVar3 = Lf_ObjRequired(p,Delay);
        Lf_ObjSetRequired(p,iVar2,iVar3);
      }
    }
  }
  if (p->pPars->fUseMux7 != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  return;
}

Assistant:

void Lf_ManCountMapRefs( Lf_Man_t * p )
{
    // compute delay
    Gia_Obj_t * pObj;
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Delay = Abc_MaxInt( Delay, Lf_ObjCoArrival2(p, i) );
    // check delay target
    if ( p->pPars->DelayTarget == -1 && p->pPars->nRelaxRatio )
        p->pPars->DelayTarget = (int)((float)Delay * (100.0 + p->pPars->nRelaxRatio) / 100.0);
    if ( p->pPars->DelayTarget != -1 )
    {
        if ( Delay < p->pPars->DelayTarget + 0.01 )
            Delay = p->pPars->DelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %d to %d.\n", p->pPars->DelayTarget, Delay );
    }
    p->pPars->Delay = Delay;
    // compute area/edges/required
    p->pPars->Mux7 = p->pPars->Area = p->pPars->Edge = p->Switches = 0;
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(p->pGia), ABC_INFINITY );
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
    if ( p->pGia->pManTime != NULL )
    {
        Tim_ManIncrementTravId( (Tim_Man_t*)p->pGia->pManTime );
        if ( p->pPars->fDoAverage )
            for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
               Tim_ManSetCoRequired( (Tim_Man_t*)p->pGia->pManTime, i, (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) );
        else  
            Tim_ManInitPoRequiredAll( (Tim_Man_t*)p->pGia->pManTime, Delay );
        Gia_ManForEachObjReverse1( p->pGia, pObj, i )
        {
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Lf_ObjMapRefNum(p, i) )
                    Lf_ManCountMapRefsOne( p, i );
            }
            else if ( Gia_ObjIsCi(pObj) )
                Tim_ManSetCiRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj), Lf_ObjRequired(p, i) );
            else if ( Gia_ObjIsCo(pObj) )
            {
                int reqTime = Tim_ManGetCoRequired( (Tim_Man_t*)p->pGia->pManTime, Gia_ObjCioId(pObj) );
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), reqTime );
            }
            else assert( 0 );
        }
    }
    else
    {
        Gia_ManForEachCoDriverId( p->pGia, Id, i )
            Lf_ObjSetRequired( p, Id, p->pPars->fDoAverage ? (int)(Lf_ObjCoArrival(p, i) * (100.0 + p->pPars->nRelaxRatio) / 100.0) : Delay );
        Gia_ManForEachAndReverse( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Lf_ObjSetRequired( p, Gia_ObjFaninId0(pObj, i), Lf_ObjRequired(p, i) );
            else if ( Lf_ObjMapRefNum(p, i) )
                Lf_ManCountMapRefsOne( p, i );
    }
    if ( p->pPars->fUseMux7 )
        Gia_ManCleanMark0(p->pGia);
}